

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TreePushOverrideID(ImGuiID id)

{
  int *piVar1;
  ImGuiWindow *pIVar2;
  uint local_14;
  
  pIVar2 = GImGui->CurrentWindow;
  Indent(0.0);
  piVar1 = &(pIVar2->DC).TreeDepth;
  *piVar1 = *piVar1 + 1;
  ImVector<unsigned_int>::push_back(&pIVar2->IDStack,&local_14);
  return;
}

Assistant:

void ImGui::TreePushOverrideID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Indent();
    window->DC.TreeDepth++;
    window->IDStack.push_back(id);
}